

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printers_tests.cpp
# Opt level: O0

void __thiscall
iu_PrintToTest_x_iutest_x_SurrogatePairChar16T_Test::
~iu_PrintToTest_x_iutest_x_SurrogatePairChar16T_Test
          (iu_PrintToTest_x_iutest_x_SurrogatePairChar16T_Test *this)

{
  iu_PrintToTest_x_iutest_x_SurrogatePairChar16T_Test *this_local;
  
  ~iu_PrintToTest_x_iutest_x_SurrogatePairChar16T_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

IUTEST(PrintToTest, SurrogatePairChar16T)
{
    const char16_t* p = u"\U00020BB7";
    const ::std::string s = ::iutest::PrintToString(p);
    if( s[0] == '?' )
    {
        // FIXME
        IUTEST_SKIP();
    }
    else
    {
#if !defined(NO_TEST_SURROGATEPAIR)
        LogChecker ck("\U00020BB7");
        (void)ck;
        IUTEST_PRINTTOSTRING_EQ(ck, s);
        IUTEST_STREAMOUT_CHECK(p);
#endif
    }
}